

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

PromiseFromSignal<void_(Object::*)()>
QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
          (Object *fsender,offset_in_Object_to_subr fsignal,Object *rsender,
          offset_in_Object_to_subr rsignal)

{
  QSharedData *pQVar1;
  PromiseData<void> *this;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  PromiseFromSignal<void_(Object::*)()> PVar2;
  offset_in_Object_to_subr in_stack_00000008;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_80;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_70;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_68;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_60;
  QPromiseConnections local_58;
  QPromiseBase<void> local_48;
  Object *local_38;
  
  *(undefined ***)fsender = &PTR__QPromiseBase_001276e0;
  local_38 = rsender;
  this = (PromiseData<void> *)operator_new(0x58);
  (this->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this);
  *(PromiseData<void> **)&fsender->field_0x8 = this;
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_48.m_d.d = *(PromiseData<void> **)&fsender->field_0x8;
  if (local_48.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_48.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127770;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_48);
  QPromiseBase<void>::~QPromiseBase(&local_48);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_60.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_68.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_68 = resolver.m_d.d;
  }
  local_70.d = (Data *)0x0;
  local_80 = resolver.m_d.d;
  std::make_shared<QtPromise::QPromiseConnections::Data>();
  QtPromisePrivate::connectSignalToResolver<Object,void(Object::*)()>
            (&local_58,(QPromiseResolve<void> *)&local_80,(Object *)fsignal,0x117212);
  QtPromisePrivate::connectSignalToResolver<void,Object,void(Object::*)(int,QString_const&)>
            (&local_58,(QPromiseReject<void> *)&local_68,local_38,in_stack_00000008);
  QtPromisePrivate::connectDestroyedToReject<void,Object>
            (&local_58,(QPromiseReject<void> *)&local_68,(Object *)fsignal);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.m_d.
              super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_68);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_70);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_80);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *(undefined ***)fsender = &PTR__QPromiseBase_00127770;
  PVar2.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  PVar2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)fsender;
  return (PromiseFromSignal<void_(Object::*)()>)PVar2.super_QPromiseBase<void>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<FSignal>
connect(const FSender* fsender, FSignal fsignal, const RSender* rsender, RSignal rsignal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<FSignal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, fsender, fsignal);
        connectSignalToResolver(connections, reject, rsender, rsignal);
        connectDestroyedToReject(connections, reject, fsender);
    }};
}